

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnMemory(SharedValidator *this,Location *loc,Limits *limits)

{
  Result RVar1;
  char *format;
  byte bVar2;
  bool bVar3;
  MemoryType local_48;
  
  if ((this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = false;
  }
  else {
    RVar1 = PrintError(this,loc,"only one memory block allowed");
    bVar3 = RVar1.enum_ == Error;
  }
  RVar1 = CheckLimits(this,loc,limits,0x10000,"pages");
  bVar2 = RVar1.enum_ == Error | bVar3;
  if (limits->is_shared == true) {
    if ((this->options_).features.threads_enabled_ == true) {
      if (limits->has_max != false) goto LAB_00197945;
      format = "shared memories must have max sizes";
    }
    else {
      format = "memories may not be shared";
    }
    RVar1 = PrintError(this,loc,format);
    bVar2 = bVar2 | RVar1.enum_ == Error;
  }
LAB_00197945:
  local_48.limits.has_max = limits->has_max;
  local_48.limits.is_shared = limits->is_shared;
  local_48.limits.is_64 = limits->is_64;
  local_48.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
  local_48.limits.initial = limits->initial;
  local_48.limits.max = limits->max;
  std::vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
  ::emplace_back<wabt::SharedValidator::MemoryType>(&this->memories_,&local_48);
  return (Result)(uint)bVar2;
}

Assistant:

Result SharedValidator::OnMemory(const Location& loc, const Limits& limits) {
  Result result = Result::Ok;
  if (memories_.size() > 0) {
    result |= PrintError(loc, "only one memory block allowed");
  }
  result |= CheckLimits(loc, limits, WABT_MAX_PAGES, "pages");

  if (limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      result |= PrintError(loc, "memories may not be shared");
    } else if (!limits.has_max) {
      result |= PrintError(loc, "shared memories must have max sizes");
    }
  }

  memories_.push_back(MemoryType{limits});
  return result;
}